

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

size_t dns_append_edns_opt(char *buf,size_t len,size_t max_len)

{
  uint16_t uVar1;
  char *pcVar2;
  char *opt;
  dns_header_t *header;
  size_t max_len_local;
  size_t len_local;
  char *buf_local;
  
  pcVar2 = dns_get_edns_opt(buf,len);
  buf_local = (char *)len;
  if ((pcVar2 == (char *)0x0) && (0xb < len)) {
    if (len + 0xb <= max_len) {
      pcVar2 = buf + len;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = ')';
      pcVar2[3] = '\x10';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
      (buf + len + 8)[0] = '\0';
      (buf + len + 8)[1] = '\0';
      buf[len + 10] = '\0';
      uVar1 = ntohs(*(uint16_t *)(buf + 10));
      uVar1 = htons(uVar1 + 1);
      *(uint16_t *)(buf + 10) = uVar1;
    }
    buf_local = (char *)(len + 0xb);
  }
  return (size_t)buf_local;
}

Assistant:

size_t dns_append_edns_opt(char * buf, size_t len, size_t max_len)
{
    struct dns_header_t * header = (struct dns_header_t *)buf;
    const char * opt = dns_get_edns_opt(buf, len);
    // ENDS OPT exists, do nothing to content
    if (opt)
        return len;
    // Too short, do nothing to content 
    if (len < sizeof(*header))
        return len;
    // Append EDNS OPT if there's enough space left
    if (max_len >= len + sizeof(edns_opt)) {
        memcpy(buf + len, edns_opt, sizeof(edns_opt));
        header->arcount = htons(ntohs(header->arcount) + 1);
    }
    // Return new size of content
    return len + sizeof(edns_opt);
}